

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_main.cc
# Opt level: O2

void __thiscall MyNN::MyNN(MyNN *this)

{
  initializer_list<unsigned_long> dims;
  initializer_list<unsigned_long> dims_00;
  initializer_list<unsigned_long> dims_01;
  initializer_list<unsigned_long> dims_02;
  initializer_list<unsigned_long> dims_03;
  initializer_list<unsigned_long> dims_04;
  initializer_list<unsigned_long> dims_05;
  initializer_list<unsigned_long> dims_06;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  TensorShape b_shape4;
  TensorShape w_shape4;
  TensorShape b_shape3;
  TensorShape w_shape3;
  TensorShape b_shape2;
  TensorShape w_shape2;
  TensorShape b_shape1;
  TensorShape local_188;
  TensorShape local_160;
  TensorShape local_138;
  TensorShape local_110;
  TensorShape local_e8;
  TensorShape local_c0;
  TensorShape local_98;
  TensorShape local_70;
  TensorShape w_shape1;
  unsigned_long local_20 [2];
  
  (this->super_NN).layers_._M_h._M_buckets = &(this->super_NN).layers_._M_h._M_single_bucket;
  (this->super_NN).layers_._M_h._M_bucket_count = 1;
  (this->super_NN).layers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_NN).layers_._M_h._M_element_count = 0;
  (this->super_NN).layers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_NN).layers_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_NN).layers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_NN)._vptr_NN = (_func_int **)&PTR_Forward_0010ebd0;
  b_shape1.dim = 2;
  b_shape1.total = 0x10;
  dims._M_len = 2;
  dims._M_array = &b_shape1.dim;
  yyml::TensorShape::TensorShape(&w_shape1,dims);
  w_shape2.dim = 1;
  w_shape2.total = 0x10;
  dims_00._M_len = 2;
  dims_00._M_array = &w_shape2.dim;
  yyml::TensorShape::TensorShape(&b_shape1,dims_00);
  b_shape2.dim = 0x10;
  b_shape2.total = 0x20;
  dims_01._M_len = 2;
  dims_01._M_array = &b_shape2.dim;
  yyml::TensorShape::TensorShape(&w_shape2,dims_01);
  w_shape3.dim = 1;
  w_shape3.total = 0x20;
  dims_02._M_len = 2;
  dims_02._M_array = &w_shape3.dim;
  yyml::TensorShape::TensorShape(&b_shape2,dims_02);
  b_shape3.dim = 0x20;
  b_shape3.total = 0x10;
  dims_03._M_len = 2;
  dims_03._M_array = &b_shape3.dim;
  yyml::TensorShape::TensorShape(&w_shape3,dims_03);
  w_shape4.dim = 1;
  w_shape4.total = 0x10;
  dims_04._M_len = 2;
  dims_04._M_array = &w_shape4.dim;
  yyml::TensorShape::TensorShape(&b_shape3,dims_04);
  b_shape4.dim = 0x10;
  b_shape4.total = 1;
  dims_05._M_len = 2;
  dims_05._M_array = &b_shape4.dim;
  yyml::TensorShape::TensorShape(&w_shape4,dims_05);
  local_20[0] = 1;
  local_20[1] = 1;
  dims_06._M_len = 2;
  dims_06._M_array = local_20;
  yyml::TensorShape::TensorShape(&b_shape4,dims_06);
  yyml::TensorShape::TensorShape(&local_70,&w_shape1);
  yyml::TensorShape::TensorShape(&local_98,&b_shape1);
  name._M_str = "dense1";
  name._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name,&local_70,&local_98);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_98.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_70.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  yyml::TensorShape::TensorShape(&local_c0,&w_shape2);
  yyml::TensorShape::TensorShape(&local_e8,&b_shape2);
  name_00._M_str = "dense2";
  name_00._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name_00,&local_c0,&local_e8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_e8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_c0.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  yyml::TensorShape::TensorShape(&local_110,&w_shape3);
  yyml::TensorShape::TensorShape(&local_138,&b_shape3);
  name_01._M_str = "dense3";
  name_01._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name_01,&local_110,&local_138);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_138.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_110.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  yyml::TensorShape::TensorShape(&local_160,&w_shape4);
  yyml::TensorShape::TensorShape(&local_188,&b_shape4);
  name_02._M_str = "dense4";
  name_02._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name_02,&local_160,&local_188);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_188.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_160.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&b_shape4.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&w_shape4.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&b_shape3.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&w_shape3.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&b_shape2.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&w_shape2.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&b_shape1.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&w_shape1.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

MyNN() {
    TensorShape w_shape1{2, 16}, b_shape1{1, 16};
    TensorShape w_shape2{16, 32}, b_shape2{1, 32};
    TensorShape w_shape3{32, 16}, b_shape3{1, 16};
    TensorShape w_shape4{16, 1}, b_shape4{1, 1};
    SetLayer<DenseLayer>("dense1", w_shape1, b_shape1);
    SetLayer<DenseLayer>("dense2", w_shape2, b_shape2);
    SetLayer<DenseLayer>("dense3", w_shape3, b_shape3);
    SetLayer<DenseLayer>("dense4", w_shape4, b_shape4);
  }